

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeoLocusIntersect.cpp
# Opt level: O2

bool ParseGeoLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  string sLocusStartLat;
  LLPoint intersection;
  string sPtIntLon;
  string sLocusGeoEndLat;
  string sPtIntLat;
  string sIntersectionLat;
  string sLocusGeoEndLong;
  string sTestId;
  double local_530;
  string sIntersectionLong;
  sregex_token_iterator it;
  LLPoint geoStart;
  string sLocusGeoStartLong;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3f8;
  string sLocusStartLong;
  string sLocusEndDist;
  string sLocusStartDist;
  string sLocusEndLong;
  string sLocusEndLat;
  string sGeodesicEndLong;
  string sGeodesicEndLat;
  string sGeodesicStartLong;
  string sGeodesicStartLat;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  LLPoint geoEnd;
  string sLocusGeoStartLat;
  
  trim(sLine1," \t\n\r\f\v");
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sGeodesicStartLat._M_dataplus._M_p = (pointer)&sGeodesicStartLat.field_2;
  sGeodesicStartLat._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  sGeodesicStartLat.field_2._M_local_buf[0] = '\0';
  sGeodesicStartLong._M_dataplus._M_p = (pointer)&sGeodesicStartLong.field_2;
  sGeodesicStartLong._M_string_length = 0;
  sGeodesicEndLat._M_dataplus._M_p = (pointer)&sGeodesicEndLat.field_2;
  sGeodesicEndLat._M_string_length = 0;
  sGeodesicStartLong.field_2._M_local_buf[0] = '\0';
  sGeodesicEndLat.field_2._M_local_buf[0] = '\0';
  sGeodesicEndLong._M_dataplus._M_p = (pointer)&sGeodesicEndLong.field_2;
  sGeodesicEndLong._M_string_length = 0;
  sGeodesicEndLong.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sLocusGeoEndLat,"([a-zA-Z]*\\d*)[,]",(allocator *)&it);
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::string::append((char *)&sLocusGeoEndLat);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&sLocusGeoEndLong,
             &sLocusGeoEndLat,0x11);
  sLocusStartLong._M_dataplus._M_p = (pointer)0x200000001;
  sLocusStartLong._M_string_length = 0x400000003;
  sLocusStartLong.field_2._M_allocated_capacity._0_4_ = 5;
  __a._M_current = (sLine1->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<5ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&it,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sLine1->_M_string_length),(regex_type *)&sLocusGeoEndLong,
             (int (*) [5])&sLocusStartLong,0);
  sLocusGeoStartLat.field_2._M_allocated_capacity = 0;
  sLocusGeoStartLat.field_2._8_8_ = 0;
  sLocusGeoStartLat._M_dataplus._M_p = (pointer)0x0;
  sLocusGeoStartLat._M_string_length = 0;
  bVar1 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=(&it,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)&sLocusGeoStartLat);
  if (bVar1) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sLocusStartLat,local_3f8);
    std::__cxx11::string::operator=((string *)&sTestId,(string *)&sLocusStartLat);
    std::__cxx11::string::~string((string *)&sLocusStartLat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sLocusGeoStartLong);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sLocusStartLat,local_3f8);
    std::__cxx11::string::operator=((string *)&sGeodesicStartLat,(string *)&sLocusStartLat);
    std::__cxx11::string::~string((string *)&sLocusStartLat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sLocusGeoStartLong);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sLocusStartLat,local_3f8);
    std::__cxx11::string::operator=((string *)&sGeodesicStartLong,(string *)&sLocusStartLat);
    std::__cxx11::string::~string((string *)&sLocusStartLat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sLocusGeoStartLong);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sLocusStartLat,local_3f8);
    std::__cxx11::string::operator=((string *)&sGeodesicEndLat,(string *)&sLocusStartLat);
    std::__cxx11::string::~string((string *)&sLocusStartLat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sLocusGeoStartLong);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sLocusGeoStartLong,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sLocusStartLat,local_3f8);
    std::__cxx11::string::operator=((string *)&sGeodesicEndLong,(string *)&sLocusStartLat);
    std::__cxx11::string::~string((string *)&sLocusStartLat);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&sLocusGeoStartLong);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)&sLocusGeoStartLat);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&it);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sLocusGeoEndLong);
  std::__cxx11::string::~string((string *)&sLocusGeoEndLat);
  sLocusGeoStartLat._M_dataplus._M_p = (pointer)&sLocusGeoStartLat.field_2;
  sLocusGeoStartLat._M_string_length = 0;
  sLocusGeoStartLat.field_2._M_allocated_capacity =
       sLocusGeoStartLat.field_2._M_allocated_capacity & 0xffffffffffffff00;
  sLocusGeoStartLong._M_dataplus._M_p = (pointer)&sLocusGeoStartLong.field_2;
  sLocusGeoStartLong._M_string_length = 0;
  sLocusGeoEndLat._M_dataplus._M_p = (pointer)&sLocusGeoEndLat.field_2;
  sLocusGeoEndLat._M_string_length = 0;
  sLocusGeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocusGeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocusGeoEndLong._M_dataplus._M_p = (pointer)&sLocusGeoEndLong.field_2;
  sLocusGeoEndLong._M_string_length = 0;
  sLocusStartLat._M_dataplus._M_p = (pointer)&sLocusStartLat.field_2;
  sLocusStartLat._M_string_length = 0;
  sLocusGeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocusStartLat.field_2._M_local_buf[0] = '\0';
  sLocusStartLong._M_dataplus._M_p = (pointer)&sLocusStartLong.field_2;
  sLocusStartLong._M_string_length = 0;
  sLocusEndLat._M_dataplus._M_p = (pointer)&sLocusEndLat.field_2;
  sLocusEndLat._M_string_length = 0;
  sLocusStartLong.field_2._M_allocated_capacity._0_4_ =
       sLocusStartLong.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  sLocusEndLat.field_2._M_local_buf[0] = '\0';
  sLocusEndLong._M_dataplus._M_p = (pointer)&sLocusEndLong.field_2;
  sLocusEndLong._M_string_length = 0;
  sLocusStartDist._M_dataplus._M_p = (pointer)&sLocusStartDist.field_2;
  sLocusStartDist._M_string_length = 0;
  sLocusEndLong.field_2._M_local_buf[0] = '\0';
  sLocusStartDist.field_2._M_local_buf[0] = '\0';
  sLocusEndDist._M_dataplus._M_p = (pointer)&sLocusEndDist.field_2;
  sLocusEndDist._M_string_length = 0;
  sIntersectionLat._M_dataplus._M_p = (pointer)&sIntersectionLat.field_2;
  sIntersectionLat._M_string_length = 0;
  sLocusEndDist.field_2._M_local_buf[0] = '\0';
  sIntersectionLat.field_2._M_local_buf[0] = '\0';
  sIntersectionLong._M_dataplus._M_p = (pointer)&sIntersectionLong.field_2;
  sIntersectionLong._M_string_length = 0;
  sIntersectionLong.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_e8,(string *)sLine2);
  bVar1 = ParseGeoLocusIntersect2
                    (&local_e8,&sLocusGeoStartLat,&sLocusGeoStartLong,&sLocusGeoEndLat,
                     &sLocusGeoEndLong,&sLocusStartLat,&sLocusStartLong,&sLocusEndLat,&sLocusEndLong
                     ,&sLocusStartDist,&sLocusEndDist);
  std::__cxx11::string::~string((string *)&local_e8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_108,(string *)sLine3);
    bVar1 = ParseGeoLocusIntersect3(&local_108,&sIntersectionLat,&sIntersectionLong);
    std::__cxx11::string::~string((string *)&local_108);
    if (bVar1) {
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      it._M_position._M_match._M_begin._M_current = (char *)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      it._M_position._M_pregex = (regex_type *)0x0;
      it._M_position._M_flags = 0;
      it._M_position._28_4_ = 0;
      it._M_position._M_begin._M_current = (char *)0x0;
      it._M_position._M_end._M_current = (char *)0x0;
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      std::__cxx11::string::string((string *)&local_128,(string *)&sLocusGeoStartLat);
      dVar4 = ParseLatitude(&local_128);
      std::__cxx11::string::string((string *)&local_148,(string *)&sLocusGeoStartLong);
      dVar5 = ParseLongitude(&local_148);
      it._M_position._M_begin._M_current = (char *)(dVar4 * 0.017453292519943295);
      it._M_position._M_end._M_current = (char *)(dVar5 * 0.017453292519943295);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::string((string *)&local_168,(string *)&sLocusGeoEndLat);
      dVar4 = ParseLatitude(&local_168);
      std::__cxx11::string::string((string *)&local_188,(string *)&sLocusGeoEndLong);
      dVar5 = ParseLongitude(&local_188);
      it._M_position._M_pregex = (regex_type *)(dVar4 * 0.017453292519943295);
      it._M_position._24_8_ = dVar5 * 0.017453292519943295;
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::string((string *)&local_1a8,(string *)&sLocusStartLat);
      dVar4 = ParseLatitude(&local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,(string *)&sLocusStartLong);
      dVar5 = ParseLongitude(&local_1c8);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar4 * 0.017453292519943295);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(dVar5 * 0.017453292519943295);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::string((string *)&local_1e8,(string *)&sLocusEndLat);
      dVar4 = ParseLatitude(&local_1e8);
      std::__cxx11::string::string((string *)&local_208,(string *)&sLocusEndLong);
      dVar5 = ParseLongitude(&local_208);
      it._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar4 * 0.017453292519943295);
      it._M_position._M_match._M_begin._M_current = (char *)(dVar5 * 0.017453292519943295);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      dVar4 = atof(sLocusStartDist._M_dataplus._M_p);
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar4 * 1852.0);
      dVar4 = atof(sLocusEndDist._M_dataplus._M_p);
      it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(dVar4 * 1852.0);
      std::__cxx11::string::string((string *)&local_228,(string *)&sGeodesicStartLat);
      dVar4 = ParseLatitude(&local_228);
      std::__cxx11::string::string((string *)&local_248,(string *)&sGeodesicStartLong);
      dVar5 = ParseLongitude(&local_248);
      geoStart.latitude = dVar4 * 0.017453292519943295;
      geoStart.longitude = dVar5 * 0.017453292519943295;
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::string((string *)&local_268,(string *)&sGeodesicEndLat);
      dVar4 = ParseLatitude(&local_268);
      std::__cxx11::string::string((string *)&local_288,(string *)&sGeodesicEndLong);
      dVar5 = ParseLongitude(&local_288);
      geoEnd.latitude = dVar4 * 0.017453292519943295;
      geoEnd.longitude = dVar5 * 0.017453292519943295;
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_268);
      intersection.latitude = 0.0;
      intersection.longitude = 0.0;
      iVar2 = GeoCalcs::GeoLocusIntersect(&geoStart,&geoEnd,(Locus *)&it,&intersection,1e-09,5e-16);
      if (iVar2 != 0) {
        sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
        local_530 = intersection.longitude * 57.29577951308232;
        ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_530);
        iVar2 = std::__cxx11::string::compare((string *)&sPtIntLat);
        bVar1 = true;
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&local_2a8,(string *)&sIntersectionLat);
          dVar5 = ParseLatitude(&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          dVar6 = ABS(dVar5 * 0.017453292519943295);
          dVar4 = ABS(intersection.latitude);
          if (dVar6 <= ABS(intersection.latitude)) {
            dVar4 = dVar6;
          }
          if (ABS(dVar5 * 0.017453292519943295 - intersection.latitude) <= dVar4 * 1e-10) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            poVar3 = std::operator<<(poVar3,(string *)&sTestId);
            poVar3 = std::operator<<(poVar3,
                                     " within rounding tolerance of 1e-10: Intersect Latitude: ");
            poVar3 = std::operator<<(poVar3,(string *)&sIntersectionLat);
            poVar3 = std::operator<<(poVar3," calced: ");
            std::operator<<(poVar3,(string *)&sPtIntLat);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            poVar3 = std::operator<<(poVar3,(string *)&sTestId);
            poVar3 = std::operator<<(poVar3," failed: Expected Intersect latitude: ");
            poVar3 = std::operator<<(poVar3,(string *)&sIntersectionLat);
            poVar3 = std::operator<<(poVar3,"  calced: ");
            std::operator<<(poVar3,(string *)&sPtIntLat);
            bVar1 = false;
          }
        }
        iVar2 = std::__cxx11::string::compare((string *)&sPtIntLon);
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&local_2c8,(string *)&sIntersectionLong);
          dVar5 = ParseLongitude(&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          dVar6 = ABS(dVar5 * 0.017453292519943295);
          dVar4 = ABS(intersection.longitude);
          if (dVar6 <= ABS(intersection.longitude)) {
            dVar4 = dVar6;
          }
          if (ABS(dVar5 * 0.017453292519943295 - intersection.longitude) <= dVar4 * 1e-10) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            poVar3 = std::operator<<(poVar3,(string *)&sTestId);
            poVar3 = std::operator<<(poVar3,
                                     " within rounding tolerance of 1e-10: Intersect Longitude: ");
            poVar3 = std::operator<<(poVar3,(string *)&sIntersectionLong);
            poVar3 = std::operator<<(poVar3," calced: ");
            std::operator<<(poVar3,(string *)&sPtIntLon);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            poVar3 = std::operator<<(poVar3,(string *)&sTestId);
            poVar3 = std::operator<<(poVar3," failed: Expected Intersect longitude: ");
            poVar3 = std::operator<<(poVar3,(string *)&sIntersectionLong);
            poVar3 = std::operator<<(poVar3,"  calced: ");
            std::operator<<(poVar3,(string *)&sPtIntLon);
            bVar1 = false;
          }
        }
        std::__cxx11::string::~string((string *)&sPtIntLon);
        std::__cxx11::string::~string((string *)&sPtIntLat);
        goto LAB_00139b7b;
      }
      iVar2 = std::__cxx11::string::compare((char *)&sIntersectionLat);
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_00139b7b;
      }
      sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
      ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
      local_530 = intersection.longitude * 57.29577951308232;
      ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_530);
      poVar3 = std::operator<<((ostream *)&std::cout,"\n");
      poVar3 = std::operator<<(poVar3,(string *)&sTestId);
      poVar3 = std::operator<<(poVar3,"failed: Expected no solution. Calced a solution of Latitude")
      ;
      poVar3 = std::operator<<(poVar3,(string *)&sPtIntLat);
      poVar3 = std::operator<<(poVar3," and Longitude ");
      std::operator<<(poVar3,(string *)&sPtIntLon);
      std::__cxx11::string::~string((string *)&sPtIntLon);
      std::__cxx11::string::~string((string *)&sPtIntLat);
    }
  }
  bVar1 = false;
LAB_00139b7b:
  std::__cxx11::string::~string((string *)&sIntersectionLong);
  std::__cxx11::string::~string((string *)&sIntersectionLat);
  std::__cxx11::string::~string((string *)&sLocusEndDist);
  std::__cxx11::string::~string((string *)&sLocusStartDist);
  std::__cxx11::string::~string((string *)&sLocusEndLong);
  std::__cxx11::string::~string((string *)&sLocusEndLat);
  std::__cxx11::string::~string((string *)&sLocusStartLong);
  std::__cxx11::string::~string((string *)&sLocusStartLat);
  std::__cxx11::string::~string((string *)&sLocusGeoEndLong);
  std::__cxx11::string::~string((string *)&sLocusGeoEndLat);
  std::__cxx11::string::~string((string *)&sLocusGeoStartLong);
  std::__cxx11::string::~string((string *)&sLocusGeoStartLat);
  std::__cxx11::string::~string((string *)&sGeodesicEndLong);
  std::__cxx11::string::~string((string *)&sGeodesicEndLat);
  std::__cxx11::string::~string((string *)&sGeodesicStartLong);
  std::__cxx11::string::~string((string *)&sGeodesicStartLat);
  std::__cxx11::string::~string((string *)&sTestId);
  return bVar1;
}

Assistant:

bool ParseGeoLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;
    trim(sLine1);
    string sTestId, sGeodesicStartLat, sGeodesicStartLong, sGeodesicEndLat, sGeodesicEndLong;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "[A-z ]+[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        regex pat(sRxPat, flags);
        int sub_matches[] = {1, 2, 3, 4, 5,};
        sregex_token_iterator it(sLine1.begin(), sLine1.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sGeodesicStartLat = *it++;
            sGeodesicStartLong = *it++;
            sGeodesicEndLat = *it++;
            sGeodesicEndLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }
    string sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong;
    string sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong;
    string sLocusStartDist, sLocusEndDist, sIntersectionLat, sIntersectionLong;

    if (!ParseGeoLocusIntersect2(sLine2, sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong,
                                 sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong, sLocusStartDist,
                                 sLocusEndDist))
        bPassed = false;
    else
    {
        if (!ParseGeoLocusIntersect3(sLine3, sIntersectionLat, sIntersectionLong))
            bPassed = false;
        else
        {
            Locus locus;
            locus.geoStart.Set(Deg2Rad(ParseLatitude(sLocusGeoStartLat)), Deg2Rad(ParseLongitude(sLocusGeoStartLong)));
            locus.geoEnd.Set(Deg2Rad(ParseLatitude(sLocusGeoEndLat)), Deg2Rad(ParseLongitude(sLocusGeoEndLong)));
            locus.locusStart.Set(Deg2Rad(ParseLatitude(sLocusStartLat)), Deg2Rad(ParseLongitude(sLocusStartLong)));
            locus.locusEnd.Set(Deg2Rad(ParseLatitude(sLocusEndLat)), Deg2Rad(ParseLongitude(sLocusEndLong)));
            locus.startDist = NmToMeters(atof(sLocusStartDist.c_str()));
            locus.endDist = NmToMeters(atof(sLocusEndDist.c_str()));

            LLPoint geoStart(Deg2Rad(ParseLatitude(sGeodesicStartLat)), Deg2Rad(ParseLongitude(sGeodesicStartLong)));
            LLPoint geoEnd(Deg2Rad(ParseLatitude(sGeodesicEndLat)), Deg2Rad(ParseLongitude(sGeodesicEndLong)));

            LLPoint intersection;
            int nVal = GeoLocusIntersect(geoStart, geoEnd, locus, intersection, kTol, kEps);
            if (nVal == 0)
            {
                if (sIntersectionLat.compare("N/A") != 0)
                {
                    string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                    string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                    cout << "\n" << sTestId << "failed: Expected no solution. Calced a solution of Latitude" <<
                    sPtIntLat << " and Longitude " << sPtIntLon;
                    bPassed = false;
                }
            }
            else
            {
                string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                if (sPtIntLat.compare(sIntersectionLat) != 0)
                {
                    double dLat = Deg2Rad(ParseLatitude(sIntersectionLat));
                    if (IsApprox(dLat, intersection.latitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Latitude: " <<
                        sIntersectionLat << " calced: " << sPtIntLat;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect latitude: " << sIntersectionLat <<
                        "  calced: " << sPtIntLat;
                        bPassed = false;
                    }
                }
                if (sPtIntLon.compare(sIntersectionLong) != 0)
                {
                    double dLon = Deg2Rad(ParseLongitude(sIntersectionLong));
                    if (IsApprox(dLon, intersection.longitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Longitude: " <<
                        sIntersectionLong << " calced: " << sPtIntLon;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect longitude: " << sIntersectionLong <<
                        "  calced: " << sPtIntLon;
                        bPassed = false;
                    }
                }

            }
        }
    }
    return bPassed;
}